

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char cVar1;
  __type _Var2;
  uint __seed;
  ostream *poVar3;
  vector *pvVar4;
  uint64_t time_offset;
  DebugStream *pDVar5;
  Image *pIVar6;
  Decompiler *pDVar7;
  int iVar8;
  char *file_name;
  ulong uVar9;
  long *plVar10;
  undefined4 in_stack_fffffffffffff76c;
  allocator local_86d;
  int local_86c;
  ulong local_868;
  ulong local_860;
  vector *local_858;
  char **local_850;
  vector<r_code::Code_*> ram_objects;
  string error;
  Settings settings;
  string local_678 [32];
  string local_658 [32];
  string self_symbol;
  string stdout_symbol;
  string stdin_symbol;
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  ofstream outfile;
  int aiStack_558 [122];
  Image seed;
  long local_2f0 [6];
  Decompiler decompiler;
  Metadata metadata;
  
  settings.usr_operator_path._M_dataplus._M_p = (pointer)&settings.usr_operator_path.field_2;
  settings.usr_operator_path._M_string_length = 0;
  settings.usr_operator_path.field_2._M_local_buf[0] = '\0';
  settings.usr_class_path._M_dataplus._M_p = (pointer)&settings.usr_class_path.field_2;
  settings.usr_class_path._M_string_length = 0;
  settings.usr_class_path.field_2._M_local_buf[0] = '\0';
  settings.source_file_name._M_dataplus._M_p = (pointer)&settings.source_file_name.field_2;
  settings.source_file_name._M_string_length = 0;
  settings.source_file_name.field_2._M_local_buf[0] = '\0';
  settings.decompilation_file_path._M_dataplus._M_p =
       (pointer)&settings.decompilation_file_path.field_2;
  settings.decompilation_file_path._M_string_length = 0;
  settings.decompilation_file_path.field_2._M_local_buf[0] = '\0';
  settings.objects_path._M_dataplus._M_p = (pointer)&settings.objects_path.field_2;
  settings.objects_path._M_string_length = 0;
  settings.objects_path.field_2._M_local_buf[0] = '\0';
  settings.models_path._M_dataplus._M_p = (pointer)&settings.models_path.field_2;
  settings.models_path._M_string_length = 0;
  settings.models_path.field_2._M_local_buf[0] = '\0';
  file_name = "settings.ini";
  std::ifstream::ifstream(&outfile,"settings.ini",_S_in);
  iVar8 = *(int *)((long)aiStack_558 + *(long *)(_outfile + -0x18));
  std::ifstream::~ifstream(&outfile);
  if (iVar8 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"loading from home");
    std::endl<char,std::char_traits<char>>(poVar3);
    file_name = "~/.config/replicode/replicode.conf";
  }
  Settings::load(&settings,file_name);
  r_comp::Image::Image(&seed);
  r_comp::Metadata::Metadata(&metadata);
  std::__cxx11::string::string(local_598,"main",(allocator *)&decompiler);
  debug((string *)&outfile);
  DebugStream::operator<<
            ((DebugStream *)&outfile,
             "Initializing with user operator library and user class code...");
  DebugStream::~DebugStream((DebugStream *)&outfile);
  std::__cxx11::string::~string(local_598);
  cVar1 = r_exec::Init(settings.usr_operator_path._M_dataplus._M_p,
                       main::anon_class_1_0_00000001::__invoke,
                       settings.usr_class_path._M_dataplus._M_p,&seed,&metadata);
  if (cVar1 == '\0') {
    iVar8 = 2;
  }
  else {
    __seed = (*r_exec::Now)();
    srand(__seed);
    std::__cxx11::string::string(local_5b8,"main",(allocator *)&decompiler);
    debug((string *)&outfile);
    DebugStream::operator<<((DebugStream *)&outfile,"compiling source...");
    DebugStream::~DebugStream((DebugStream *)&outfile);
    std::__cxx11::string::~string(local_5b8);
    error._M_dataplus._M_p = (pointer)&error.field_2;
    error._M_string_length = 0;
    error.field_2._M_local_buf[0] = '\0';
    cVar1 = r_exec::Compile(settings.source_file_name._M_dataplus._M_p,(string *)&error,&seed,
                            &metadata,false);
    if (cVar1 == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cerr," <- ");
      poVar3 = std::operator<<(poVar3,(string *)&error);
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar8 = 3;
    }
    else {
      std::__cxx11::string::string(local_5d8,"main",(allocator *)&decompiler);
      debug((string *)&outfile);
      DebugStream::operator<<((DebugStream *)&outfile,"source compiled!");
      DebugStream::~DebugStream((DebugStream *)&outfile);
      std::__cxx11::string::~string(local_5d8);
      r_comp::Decompiler::Decompiler(&decompiler);
      r_comp::Decompiler::init((Metadata *)&decompiler);
      if (settings.get_objects == true) {
        pvVar4 = (vector *)operator_new(0x510);
        r_exec::Mem<r_exec::LObject,_r_exec::MemStatic>::Mem
                  ((Mem<r_exec::LObject,_r_exec::MemStatic> *)pvVar4);
      }
      else {
        pvVar4 = (vector *)operator_new(0x4e8);
        r_exec::Mem<r_exec::LObject,_r_exec::MemVolatile>::Mem
                  ((Mem<r_exec::LObject,_r_exec::MemVolatile> *)pvVar4);
      }
      ram_objects.m_vector.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ram_objects.m_vector.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ram_objects.m_vector.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_86c = argc;
      r_comp::Image::get_objects((Mem *)&seed,pvVar4);
      *(Metadata **)(pvVar4 + 0x4d8) = &metadata;
      local_858 = pvVar4;
      r_exec::_Mem::init((ulong)pvVar4,settings.base_period,settings.reduction_core_count,
                         settings.mdl_inertia_sr_thr,settings.time_core_count,settings.tpx_dsr_thr,
                         settings.mdl_inertia_cnt_thr,settings.min_sim_time_horizon,
                         settings.sim_time_horizon,settings.max_sim_time_horizon,
                         settings.tpx_time_horizon,settings.float_tolerance,
                         settings.perf_sampling_period,settings.time_tolerance,settings.primary_thz,
                         (bool)(undefined1)settings.secondary_thz,
                         CONCAT44(in_stack_fffffffffffff76c,(uint)settings.debug),
                         settings.ntf_mk_resilience,settings.goal_pred_success_resilience,
                         settings.probe_level);
      std::__cxx11::string::string((string *)&stdin_symbol,"stdin",(allocator *)&outfile);
      std::__cxx11::string::string((string *)&stdout_symbol,"stdout",(allocator *)&outfile);
      local_850 = argv;
      std::__cxx11::string::string((string *)&self_symbol,"self",(allocator *)&outfile);
      plVar10 = local_2f0;
      local_868 = 0;
      local_860 = 0;
      uVar9 = 0;
      while (pvVar4 = local_858, plVar10 = (long *)*plVar10, plVar10 != (long *)0x0) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar10 + 2);
        _Var2 = std::operator==(__lhs,&stdin_symbol);
        if (_Var2) {
          uVar9 = (ulong)*(uint *)(plVar10 + 1);
        }
        else {
          _Var2 = std::operator==(__lhs,&stdout_symbol);
          if (_Var2) {
            local_860 = (ulong)*(uint *)(plVar10 + 1);
          }
          else {
            _Var2 = std::operator==(__lhs,&self_symbol);
            if (_Var2) {
              local_868 = (ulong)*(uint *)(plVar10 + 1);
            }
          }
        }
      }
      cVar1 = r_exec::_Mem::load((vector *)local_858,(ulong)&ram_objects,uVar9,local_860);
      if (cVar1 == '\0') {
        iVar8 = 4;
      }
      else {
        time_offset = r_exec::_Mem::start();
        std::__cxx11::string::string(local_658,"main",&local_86d);
        debug((string *)&outfile);
        pDVar5 = DebugStream::operator<<((DebugStream *)&outfile,"running for");
        pDVar5 = DebugStream::operator<<(pDVar5,settings.run_time);
        DebugStream::operator<<(pDVar5,"ms");
        DebugStream::~DebugStream((DebugStream *)&outfile);
        std::__cxx11::string::~string(local_658);
        _outfile = (pointer)settings.run_time;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&outfile);
        std::__cxx11::string::string(local_678,"main",&local_86d);
        debug((string *)&outfile);
        DebugStream::operator<<((DebugStream *)&outfile,"shutting rMem down...");
        DebugStream::~DebugStream((DebugStream *)&outfile);
        std::__cxx11::string::~string(local_678);
        r_exec::_Mem::stop();
        if (settings.get_objects == true) {
          pIVar6 = (Image *)(**(code **)(*(long *)pvVar4 + 0x58))(pvVar4);
          if (settings.write_objects == true) {
            pDVar7 = (Decompiler *)0x0;
            if (settings.test_objects != false) {
              pDVar7 = &decompiler;
            }
            write_to_file(pIVar6,&settings.objects_path,pDVar7,time_offset);
          }
          if ((settings.decompile_objects == true) &&
             ((settings.write_objects != true || (settings.test_objects == false)))) {
            if (settings.decompile_to_file == true) {
              std::ofstream::ofstream(&outfile);
              std::ofstream::open((char *)&outfile,
                                  (_Ios_Openmode)settings.decompilation_file_path._M_dataplus._M_p);
              std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
              decompile(&decompiler,pIVar6,time_offset,settings.ignore_named_objects);
              std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
              std::ofstream::close();
              std::ofstream::~ofstream(&outfile);
            }
            else {
              decompile(&decompiler,pIVar6,time_offset,settings.ignore_named_objects);
            }
          }
          if (pIVar6 != (Image *)0x0) {
            r_comp::Image::~Image(pIVar6);
          }
          operator_delete(pIVar6);
        }
        if (settings.get_models == true) {
          pIVar6 = (Image *)r_exec::_Mem::get_models();
          if (settings.write_models == true) {
            pDVar7 = (Decompiler *)0x0;
            if (settings.test_models != false) {
              pDVar7 = &decompiler;
            }
            write_to_file(pIVar6,&settings.models_path,pDVar7,time_offset);
          }
          if ((settings.decompile_models == true) &&
             ((settings.write_models != true || (settings.test_models == false)))) {
            if (local_86c < 3) {
              decompile(&decompiler,pIVar6,time_offset,settings.ignore_named_models);
            }
            else {
              std::ofstream::ofstream(&outfile);
              std::ofstream::open((char *)&outfile,(_Ios_Openmode)local_850[2]);
              std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
              decompile(&decompiler,pIVar6,time_offset,settings.ignore_named_models);
              std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
              std::ofstream::close();
              std::ofstream::~ofstream(&outfile);
            }
          }
          if (pIVar6 != (Image *)0x0) {
            r_comp::Image::~Image(pIVar6);
          }
          operator_delete(pIVar6);
        }
        r_comp::RepliStruct::cleanup();
        (**(code **)(*(long *)pvVar4 + 0x28))(pvVar4);
        iVar8 = 0;
      }
      std::__cxx11::string::~string((string *)&self_symbol);
      std::__cxx11::string::~string((string *)&stdout_symbol);
      std::__cxx11::string::~string((string *)&stdin_symbol);
      std::_Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>::~_Vector_base
                ((_Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_> *)&ram_objects);
      r_comp::Decompiler::~Decompiler(&decompiler);
    }
    std::__cxx11::string::~string((string *)&error);
  }
  r_comp::Metadata::~Metadata(&metadata);
  r_comp::Image::~Image(&seed);
  Settings::~Settings(&settings);
  return iVar8;
}

Assistant:

int main(int argc, char **argv)
{
    Settings settings;

    // First try to load local config, otherwise user config, otherwise just
    // use default values
    if (fileExists("settings.ini")) {
        settings.load("settings.ini");
    } else {
        std::cout << "loading from home" << std::endl;
        settings.load("~/.config/replicode/replicode.conf");
    }

    r_comp::Image seed;
    r_comp::Metadata metadata;
    debug("main") << "Initializing with user operator library and user class code...";
    using namespace std::chrono;

    if (!r_exec::Init(settings.usr_operator_path.c_str(),
                      []() -> uint64_t {
                         return duration_cast<microseconds>(high_resolution_clock::now().time_since_epoch()).count();
                      },
                      settings.usr_class_path.c_str(),
                      &seed,
                      &metadata)) {
        return 2;
    }
    srand(r_exec::Now());
    debug("main") << "compiling source...";
    std::string error;

    if (!r_exec::Compile(settings.source_file_name.c_str(), error, &seed, &metadata, false)) {
        std::cerr << " <- " << error << std::endl;
        return 3;
    }

    debug("main") << "source compiled!";
#if defined(WIN32) || defined(WIN64)
    r_exec::PipeOStream::Open(settings.debug_windows);
#endif
    Decompiler decompiler;
    decompiler.init(&metadata);
    r_exec::_Mem *mem;

    if (settings.get_objects) {
        mem = new r_exec::Mem<r_exec::LObject, r_exec::MemStatic>();
    } else {
        mem = new r_exec::Mem<r_exec::LObject, r_exec::MemVolatile>();
    }

    r_code::vector<r_code::Code *> ram_objects;
    seed.get_objects(mem, ram_objects);
    mem->metadata = &metadata;
    mem->init(settings.base_period,
              settings.reduction_core_count,
              settings.time_core_count,
              settings.mdl_inertia_sr_thr,
              settings.mdl_inertia_cnt_thr,
              settings.tpx_dsr_thr,
              settings.min_sim_time_horizon,
              settings.max_sim_time_horizon,
              settings.sim_time_horizon,
              settings.tpx_time_horizon,
              settings.perf_sampling_period,
              settings.float_tolerance,
              settings.time_tolerance,
              settings.primary_thz,
              settings.secondary_thz,
              settings.debug,
              settings.ntf_mk_resilience,
              settings.goal_pred_success_resilience,
              settings.probe_level,
              settings.trace_levels);
    uint64_t stdin_oid = 0;
    std::string stdin_symbol("stdin");
    uint64_t stdout_oid = 0;
    std::string stdout_symbol("stdout");
    uint64_t self_oid = 0;
    std::string self_symbol("self");
    std::unordered_map<uintptr_t, std::string>::const_iterator n;

    for (const auto &symbol : seed.object_names.symbols) {
        if (symbol.second == stdin_symbol) {
            stdin_oid = symbol.first;
        } else if (symbol.second == stdout_symbol) {
            stdout_oid = symbol.first;
        } else if (symbol.second == self_symbol) {
            self_oid = symbol.first;
        }
    }

    if (!mem->load(ram_objects.as_std(), stdin_oid, stdout_oid, self_oid)) {
        return 4;
    }

    uint64_t starting_time = mem->start();
    debug("main") << "running for" << settings.run_time << "ms";
    std::this_thread::sleep_for(std::chrono::milliseconds(settings.run_time));
    /*Thread::Sleep(settings.run_time/2);
      test_many_injections(mem,
      argc > 2 ? atoi(argv[2]) : 100, // sampling period in ms
      argc > 3 ? atoi(argv[3]) : 600, // number of batches
      argc > 4 ? atoi(argv[4]) : 66); // number of objects per batch
      Thread::Sleep(settings.run_time/2);*/
    debug("main") << "shutting rMem down...";
    mem->stop();

    if (settings.get_objects) {
        //TimeProbe probe;
        //probe.set();
        r_comp::Image *image = mem->get_objects();
        //probe.check();
        image->object_names.symbols = image->object_names.symbols;

        if (settings.write_objects) {
            write_to_file(image, settings.objects_path, settings.test_objects ? &decompiler : nullptr, starting_time);
        }

        if (settings.decompile_objects && (!settings.write_objects || !settings.test_objects)) {
            if (settings.decompile_to_file) { // argv[2] is a file to redirect the decompiled code to.
                std::ofstream outfile;
                outfile.open(settings.decompilation_file_path.c_str(), std::ios_base::trunc);
                std::streambuf *coutbuf = std::cout.rdbuf(outfile.rdbuf());
                decompile(decompiler, image, starting_time, settings.ignore_named_objects);
                std::cout.rdbuf(coutbuf);
                outfile.close();
            } else {
                decompile(decompiler, image, starting_time, settings.ignore_named_objects);
            }
        }

        delete image;
        //std::cout<<"get_image(): "<<probe.us()<<"us"<<std::endl;
    }

    if (settings.get_models) {
        //TimeProbe probe;
        //probe.set();
        r_comp::Image *image = mem->get_models();
        //probe.check();
        image->object_names.symbols = image->object_names.symbols;

        if (settings.write_models) {
            write_to_file(image, settings.models_path, settings.test_models ? &decompiler : nullptr, starting_time);
        }

        if (settings.decompile_models && (!settings.write_models || !settings.test_models)) {
            if (argc > 2) { // argv[2] is a file to redirect the decompiled code to.
                std::ofstream outfile;
                outfile.open(argv[2], std::ios_base::trunc);
                std::streambuf *coutbuf = std::cout.rdbuf(outfile.rdbuf());
                decompile(decompiler, image, starting_time, settings.ignore_named_models);
                std::cout.rdbuf(coutbuf);
                outfile.close();
            } else {
                decompile(decompiler, image, starting_time, settings.ignore_named_models);
            }
        }

        delete image;
        //std::cout<<"get_models(): "<<probe.us()<<"us"<<std::endl;
    }
    RepliStruct::cleanup();

    delete mem;
#if defined(WIN32) || defined(WIN64)
    r_exec::PipeOStream::Close();
#endif
    return 0;
}